

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

void Rnm_ManJustify_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Rnm_Obj_t RVar1;
  Rnm_Obj_t RVar2;
  int iVar3;
  uint uVar4;
  Rnm_Obj_t *pRVar5;
  Rnm_Obj_t *pRVar6;
  Rnm_Obj_t *pRVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  
LAB_004fa3f8:
  pRVar5 = Rnm_ManObj(p,pObj,f);
  if (((uint)*pRVar5 & 2) == 0) {
    if (p->fPropFanout == 0) {
      *pRVar5 = (Rnm_Obj_t)((uint)*pRVar5 | 2);
      pRVar6 = Rnm_ManObj(p,pObj,0);
      if (((uint)*pRVar6 & 4) == 0) {
        pRVar6 = Rnm_ManObj(p,pObj,0);
        *(byte *)pRVar6 = *(byte *)pRVar6 | 4;
        p->nVisited = p->nVisited + 1;
      }
    }
    else {
      Rnm_ManJustifyPropFanout_rec(p,pObj,f,vSelect);
    }
    if (((uint)*pRVar5 & 8) == 0) {
      iVar3 = Gia_ObjIsPi(p->pGia,pObj);
      if (iVar3 != 0) {
        return;
      }
      if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
        return;
      }
      iVar3 = Gia_ObjIsRo(p->pGia,pObj);
      if (iVar3 == 0) {
        if (((int)(uint)*(undefined8 *)pObj < 0) ||
           (uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar4 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                        ,0x25d,"void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                       );
        }
        pRVar6 = Rnm_ManObj(p,pObj + -(ulong)uVar4,f);
        pRVar7 = Rnm_ManObj(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),f);
        RVar1 = *pRVar6;
        if (((uint)*pRVar5 & 1) == 0) {
          uVar8 = *(ulong *)pObj;
          RVar2 = *pRVar7;
          uVar4 = (uint)(uVar8 >> 0x3d) ^ (uint)RVar2;
          if ((((uint)(uVar8 >> 0x1d) & 7 ^ (uint)RVar1) & 1) == 0) {
            if ((uVar4 & 1) == 0) {
              uVar4 = (uint)RVar1 >> 4 & 0xffffff;
              uVar10 = (uint)RVar2 >> 4 & 0xffffff;
              if (uVar10 < uVar4) {
                if (uVar10 == 0) {
                  return;
                }
                goto LAB_004fa590;
              }
            }
            else {
              uVar4 = (uint)RVar1 & 0xffffff0;
            }
            if (uVar4 == 0) {
              return;
            }
          }
          else {
            if ((uVar4 & 1) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                            ,0x25a,
                            "void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
            }
            if (((uint)RVar2 & 0xffffff0) == 0) {
              return;
            }
LAB_004fa590:
            uVar8 = uVar8 >> 0x20;
          }
        }
        else {
          if (((uint)RVar1 & 0xffffff0) != 0) {
            Rnm_ManJustify_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),f,vSelect);
          }
          if (((uint)*pRVar7 & 0xffffff0) == 0) {
            return;
          }
          uVar8 = (ulong)*(uint *)&pObj->field_0x4;
        }
        pObj = pObj + -(ulong)((uint)uVar8 & 0x1fffffff);
      }
      else {
        if (f < 1) {
          return;
        }
        pGVar9 = Gia_ObjRoToRi(p->pGia,pObj);
        pObj = pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff);
        f = f + -1;
      }
      goto LAB_004fa3f8;
    }
    if (((uint)*pRVar5 & 0xffffff0) == 0) {
      __assert_fail("(int)pRnm->Prio > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                    ,0x21f,"void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
    }
    if (p->fPropFanout == 0) {
      iVar3 = Gia_ObjId(p->pGia,pObj);
      Vec_IntPush(vSelect,iVar3);
      return;
    }
    for (iVar3 = p->pCex->iFrame; -1 < iVar3; iVar3 = iVar3 + -1) {
      pRVar5 = Rnm_ManObj(p,pObj,iVar3);
      if (((uint)*pRVar5 & 2) == 0) {
        Rnm_ManJustifyPropFanout_rec(p,pObj,iVar3,vSelect);
      }
    }
  }
  return;
}

Assistant:

void Rnm_ManJustify_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{ 
    Rnm_Obj_t * pRnm = Rnm_ManObj( p, pObj, f );
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    if ( pRnm->fVisit )
        return;
    if ( p->fPropFanout )
        Rnm_ManJustifyPropFanout_rec( p, pObj, f, vSelect );
    else
    {
        pRnm->fVisit = 1;
        if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
        {
            Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
            p->nVisited++;
        }
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        if ( p->fPropFanout )
        {
            for ( i = p->pCex->iFrame; i >= 0; i-- )
                if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                    Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
//            for ( i = p->pCex->iFrame; i >= 0; i-- )
//                Rnm_ManObj(p, pObj, i)->fVisit = 1;
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Rnm_ManJustify_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rnm_Obj_t * pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
        Rnm_Obj_t * pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
        if ( pRnm->Value == 1 )
        {
            if ( pRnm0->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            if ( pRnm1->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
        }
        else // select one value
        {
            if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm0->Prio <= pRnm1->Prio ) // choice
                {
                    if ( pRnm0->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
                }
                else
                {
                    if ( pRnm1->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
                }
            }
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRnm0->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            }
            else if ( (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm1->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}